

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> * __thiscall
kj::Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::operator=
          (Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *this,
          Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *other)

{
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *other_local;
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (Branch *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }